

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

int __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get_codepoint(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                *this)

{
  int local_c;
  
  if (this->current == 0x75) {
    lexer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
    ::get_codepoint();
    return local_c;
  }
  __assert_fail("current == \'u\'",
                "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                ,0x8e1,
                "int nlohmann::detail::lexer<nlohmann::basic_json<>>::get_codepoint() [BasicJsonType = nlohmann::basic_json<>]"
               );
}

Assistant:

int get_codepoint() {
		// this function only makes sense after reading `\u`
		assert(current == 'u');
		int codepoint = 0;

		const auto factors = {12, 8, 4, 0};
		for (const auto factor : factors) {
			get();

			if (current >= '0' and current <= '9') {
				codepoint += ((current - 0x30) << factor);
			} else if (current >= 'A' and current <= 'F') {
				codepoint += ((current - 0x37) << factor);
			} else if (current >= 'a' and current <= 'f') {
				codepoint += ((current - 0x57) << factor);
			} else {
				return -1;
			}
		}

		assert(0x0000 <= codepoint and codepoint <= 0xFFFF);
		return codepoint;
	}